

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

CommandLineFlag * __thiscall
gflags::anon_unknown_2::FlagRegistry::SplitArgumentLocked
          (FlagRegistry *this,char *arg,string *key,char **v,string *error_message)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  CommandLineFlag *pCVar4;
  string local_50;
  
  pcVar3 = strchr(arg,0x3d);
  if (pcVar3 == (char *)0x0) {
    pcVar2 = (char *)key->_M_string_length;
    strlen(arg);
    pcVar3 = (char *)0x0;
    std::__cxx11::string::_M_replace((ulong)key,0,pcVar2,(ulong)arg);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)key,0,(char *)key->_M_string_length,(ulong)arg);
    pcVar3 = pcVar3 + 1;
  }
  *v = pcVar3;
  pcVar3 = (key->_M_dataplus)._M_p;
  pCVar4 = FindFlagLocked(this,pcVar3);
  if (pCVar4 != (CommandLineFlag *)0x0) {
    if (*v != (char *)0x0) {
      return pCVar4;
    }
    if (pCVar4->defvalue_->type_ != '\0') {
      return pCVar4;
    }
    pcVar3 = "1";
LAB_00132acc:
    *v = pcVar3;
    return pCVar4;
  }
  if ((*pcVar3 == 'n') && (pcVar3[1] == 'o')) {
    pcVar3 = pcVar3 + 2;
    pCVar4 = FindFlagLocked(this,pcVar3);
    if (pCVar4 != (CommandLineFlag *)0x0) {
      cVar1 = pCVar4->defvalue_->type_;
      if ((long)cVar1 == 0) {
        pcVar2 = (char *)key->_M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)key,0,pcVar2,(ulong)pcVar3);
        pcVar3 = "0";
        goto LAB_00132acc;
      }
      if ('\x06' < cVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                      ,0x1b6,
                      "const char *gflags::(anonymous namespace)::FlagValue::TypeName() const");
      }
      StringPrintf_abi_cxx11_
                (&local_50,"%sboolean value (%s) specified for %s command line flag\n","ERROR: ",
                 (key->_M_dataplus)._M_p,
                 &(anonymous_namespace)::FlagValue::TypeName()::types + (long)cVar1 * 7);
      goto LAB_00132b68;
    }
  }
  StringPrintf_abi_cxx11_
            (&local_50,"%sunknown command line flag \'%s\'\n","ERROR: ",(key->_M_dataplus)._M_p);
LAB_00132b68:
  std::__cxx11::string::operator=((string *)error_message,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (CommandLineFlag *)0x0;
}

Assistant:

CommandLineFlag* FlagRegistry::SplitArgumentLocked(const char* arg,
                                                   string* key,
                                                   const char** v,
                                                   string* error_message) {
  // Find the flag object for this option
  const char* flag_name;
  const char* value = strchr(arg, '=');
  if (value == NULL) {
    key->assign(arg);
    *v = NULL;
  } else {
    // Strip out the "=value" portion from arg
    key->assign(arg, value-arg);
    *v = ++value;    // advance past the '='
  }
  flag_name = key->c_str();

  CommandLineFlag* flag = FindFlagLocked(flag_name);

  if (flag == NULL) {
    // If we can't find the flag-name, then we should return an error.
    // The one exception is if 1) the flag-name is 'nox', 2) there
    // exists a flag named 'x', and 3) 'x' is a boolean flag.
    // In that case, we want to return flag 'x'.
    if (!(flag_name[0] == 'n' && flag_name[1] == 'o')) {
      // flag-name is not 'nox', so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    flag = FindFlagLocked(flag_name+2);
    if (flag == NULL) {
      // No flag named 'x' exists, so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    if (flag->Type() != FlagValue::FV_BOOL) {
      // 'x' exists but is not boolean, so we're not in the exception case.
      *error_message = StringPrintf(
          "%sboolean value (%s) specified for %s command line flag\n",
          kError, key->c_str(), flag->type_name());
      return NULL;
    }
    // We're in the exception case!
    // Make up a fake value to replace the "no" we stripped out
    key->assign(flag_name+2);   // the name without the "no"
    *v = "0";
  }

  // Assign a value if this is a boolean flag
  if (*v == NULL && flag->Type() == FlagValue::FV_BOOL) {
    *v = "1";    // the --nox case was already handled, so this is the --x case
  }

  return flag;
}